

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

string * fmt::v7::detail::vformat_abi_cxx11_(string_view format_str,format_args args)

{
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> custom;
  bool bVar1;
  size_t sVar2;
  char *lhs;
  string *in_RDI;
  memory_buffer buffer;
  format_arg arg;
  allocator<char> *in_stack_fffffffffffffab8;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this;
  char *in_stack_fffffffffffffac8;
  error_handler *in_stack_fffffffffffffad0;
  undefined8 in_stack_fffffffffffffad8;
  int id;
  string *this_00;
  locale_ref local_510;
  monostate *in_stack_fffffffffffffaf8;
  longdouble *in_stack_fffffffffffffb08;
  uint value;
  basic_string_view<char> *in_stack_fffffffffffffb18;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffb20;
  unsigned_long_long in_stack_fffffffffffffb28;
  allocator<char> local_4c9 [9];
  undefined1 in_stack_fffffffffffffb40 [16];
  buffer<char> *in_stack_fffffffffffffbc0;
  locale_ref in_stack_fffffffffffffbc8;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  in_stack_fffffffffffffbd0;
  basic_string_view<char> in_stack_fffffffffffffbe0;
  undefined1 local_2aa [2];
  undefined4 local_2a8;
  undefined4 uStack_2a4;
  undefined2 uStack_2a0;
  undefined6 uStack_29e;
  stringifier *in_stack_fffffffffffffd68;
  custom_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  in_stack_fffffffffffffd70;
  basic_string_view<char> local_270 [2];
  handle local_248;
  basic_string_view<char> local_238 [3];
  undefined4 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1e0;
  undefined1 *local_1c8;
  undefined1 *local_1b0;
  undefined1 *local_198;
  undefined1 *local_160;
  undefined1 *local_110;
  byte local_e1;
  undefined1 *local_e0;
  basic_format_arg local_c9;
  undefined1 *local_c8;
  undefined1 *local_b0;
  undefined1 *local_98;
  undefined1 *local_78;
  undefined1 *local_60;
  undefined1 *local_50;
  char *local_48;
  size_t local_40;
  undefined1 *local_28;
  undefined1 *local_18;
  
  id = (int)((ulong)in_stack_fffffffffffffad8 >> 0x20);
  this_00 = in_RDI;
  sVar2 = basic_string_view<char>::size(local_270);
  if (sVar2 == 2) {
    lhs = basic_string_view<char>::data(local_270);
    bVar1 = equal2(lhs,"{}");
    if (bVar1) {
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::get((basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
             *)this_00,id);
      bVar1 = basic_format_arg::operator_cast_to_bool((basic_format_arg *)&local_2a8);
      if (bVar1) {
        local_1e0 = local_2aa;
        local_200 = &local_2a8;
        bVar1 = SUB81((ulong)in_stack_fffffffffffffb08 >> 0x38,0);
        value = (uint)((ulong)in_stack_fffffffffffffb08 >> 0x20);
        local_1f8 = local_1e0;
        switch((ulong)in_stack_fffffffffffffd68 & 0xffffffff) {
        case 0:
          break;
        case 1:
          to_string<int,_0>(value);
          return in_RDI;
        case 2:
          local_1c8 = local_1e0;
          to_string<unsigned_int,_0>(value);
          return in_RDI;
        case 3:
          local_1b0 = local_1e0;
          to_string<long_long,_0>((longlong)in_stack_fffffffffffffb18);
          return in_RDI;
        case 4:
          local_198 = local_1e0;
          to_string<unsigned_long_long,_0>(in_stack_fffffffffffffb28);
          return in_RDI;
        case 5:
          local_160 = local_1e0;
          to_string<__int128,_0>((__int128)in_stack_fffffffffffffb40);
          return in_RDI;
        case 6:
          local_110 = local_1e0;
          to_string<unsigned___int128,_0>((unsigned___int128)in_stack_fffffffffffffb40);
          return in_RDI;
        case 7:
          local_e1 = (byte)local_2a8._0_1_ & 1;
          local_e0 = local_1e0;
          to_string<bool,_0>(bVar1);
          return in_RDI;
        case 8:
          local_c9 = local_2a8._0_1_;
          local_c8 = local_1e0;
          to_string<char,_0>(bVar1);
          return in_RDI;
        case 9:
          local_b0 = local_1e0;
          to_string<float,_0>((float *)in_stack_fffffffffffffaf8);
          return in_RDI;
        case 10:
          local_98 = local_1e0;
          to_string<double,_0>((double *)in_stack_fffffffffffffaf8);
          return in_RDI;
        case 0xb:
          local_78 = local_1e0;
          to_string<long_double,_0>(in_stack_fffffffffffffb08);
          return in_RDI;
        case 0xc:
          local_60 = local_1e0;
          to_string<const_char_*,_0>((char **)in_stack_fffffffffffffaf8);
          return in_RDI;
        case 0xd:
          basic_string_view<char>::basic_string_view
                    (local_238,(char *)CONCAT44(uStack_2a4,local_2a8),
                     CONCAT62(uStack_29e,uStack_2a0));
          local_48 = local_238[0].data_;
          local_40 = local_238[0].size_;
          local_50 = local_1e0;
          to_string<fmt::v7::basic_string_view<char>,_0>(in_stack_fffffffffffffb18);
          return in_RDI;
        case 0xe:
          local_28 = local_1e0;
          to_string<const_void_*,_0>((void **)in_stack_fffffffffffffaf8);
          return in_RDI;
        case 0xf:
          custom.value._4_4_ = uStack_2a4;
          custom.value._0_4_ = local_2a8;
          custom.format._0_2_ = uStack_2a0;
          custom.format._2_6_ = uStack_29e;
          basic_format_arg<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::handle::handle(&local_248,custom);
          stringifier::operator()[abi_cxx11_
                    (in_stack_fffffffffffffd68,(handle)in_stack_fffffffffffffd70);
          return in_RDI;
        }
        local_18 = local_1e0;
        to_string<fmt::v7::monostate,_0>(in_stack_fffffffffffffaf8);
        return in_RDI;
      }
      error_handler::on_error(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    }
  }
  this = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_4c9;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            (this,in_stack_fffffffffffffab8);
  std::allocator<char>::~allocator(local_4c9);
  locale_ref::locale_ref(&local_510);
  vformat_to<char>(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd0,
                   in_stack_fffffffffffffbc8);
  to_string<char,500ul>(in_stack_fffffffffffffb20);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this);
  return in_RDI;
}

Assistant:

FMT_FUNC std::string detail::vformat(string_view format_str, format_args args) {
  if (format_str.size() == 2 && equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    return visit_format_arg(stringifier(), arg);
  }
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str, args);
  return to_string(buffer);
}